

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Speed> metaf::Speed::fromString(string *s,Unit unit)

{
  _Optional_base<metaf::Speed,_true,_true> _Var1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  Speed *in_RDI;
  Speed speed;
  optional<unsigned_int> spd;
  Speed *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_28 [16];
  Speed *digits;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffff0;
  string *in_stack_fffffffffffffff8;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar2 = std::operator==(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    if (!bVar2) {
      lVar4 = std::__cxx11::string::length();
      if (lVar4 != 2) {
        lVar4 = std::__cxx11::string::length();
        if (lVar4 != 3) {
          in_stack_fffffffffffffff0 = (_Optional_payload_base<unsigned_int>)0;
          in_stack_fffffffffffffff8 = (string *)0;
          goto LAB_00243165;
        }
      }
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 3) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
        if (*pcVar5 == '0') {
          in_stack_fffffffffffffff0 = (_Optional_payload_base<unsigned_int>)0;
          in_stack_fffffffffffffff8 = (string *)0;
          goto LAB_00243165;
        }
      }
      digits = in_RDI;
      std::__cxx11::string::length();
      strToUint(in_stack_fffffffffffffff8,(size_t)in_stack_fffffffffffffff0,(size_t)digits);
      bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x243105);
      if (bVar2) {
        Speed(in_RDI);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24313f);
        std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
                  (&in_RDI->speedValue,(uint *)in_stack_ffffffffffffffa8);
        std::optional<metaf::Speed>::optional<metaf::Speed,_true>
                  ((optional<metaf::Speed> *)in_RDI,in_stack_ffffffffffffffa8);
      }
      else {
        in_stack_fffffffffffffff0 = (_Optional_payload_base<unsigned_int>)0;
        in_stack_fffffffffffffff8 = (string *)0;
      }
      goto LAB_00243165;
    }
  }
  memset(local_28,0,0xc);
  Speed((Speed *)in_stack_ffffffffffffffb0);
  std::optional<metaf::Speed>::optional<metaf::Speed,_true>
            ((optional<metaf::Speed> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_00243165:
  _Var1._M_payload.super__Optional_payload_base<metaf::Speed>._8_8_ = in_stack_fffffffffffffff8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Speed>._M_payload._M_value.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(optional<unsigned_int>)in_stack_fffffffffffffff0;
  return (_Optional_base<metaf::Speed,_true,_true>)
         (_Optional_base<metaf::Speed,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Speed>;
}

Assistant:

std::optional<Speed> Speed::fromString(const std::string & s, Unit unit) {
	//static const std::regex rgx ("([1-9]?\\d\\d)|//");
	static const std::optional<Speed> error;
	if (s.empty() || s == "//") return Speed();
	if (s.length() != 2 && s.length() != 3) return error;
	if (s.length() == 3 && s[0] == '0') return error;
	const auto spd = strToUint(s, 0, s.length());
	if (!spd.has_value()) return error;
	Speed speed;
	speed.speedUnit = unit;
	speed.speedValue = *spd;
	return speed;
}